

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O0

void __thiscall
MemoryLeakOutputStringBuffer::reportMemoryLeak
          (MemoryLeakOutputStringBuffer *this,MemoryLeakDetectorNode *leak)

{
  uint uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uint uVar4;
  int iVar5;
  SimpleStringBuffer *this_00;
  undefined8 uVar6;
  char *s1;
  SimpleStringBuffer *in_RSI;
  long *in_RDI;
  undefined4 in_stack_ffffffffffffffe0;
  
  if (*in_RDI == 0) {
    addMemoryLeakHeader((MemoryLeakOutputStringBuffer *)0x17e5c8);
  }
  *in_RDI = *in_RDI + 1;
  this_00 = (SimpleStringBuffer *)(in_RDI + 2);
  uVar1 = *(uint *)(in_RSI->buffer_ + 8);
  uVar2 = *(undefined8 *)in_RSI->buffer_;
  uVar3 = *(undefined8 *)(in_RSI->buffer_ + 0x18);
  uVar4 = (uint)*(undefined8 *)(in_RSI->buffer_ + 0x20);
  uVar6 = (**(code **)(**(long **)(in_RSI->buffer_ + 0x28) + 0x28))();
  SimpleStringBuffer::add
            (this_00,
             "Alloc num (%u) Leak size: %lu Allocated at: %s and line: %d. Type: \"%s\"\n\tMemory: <%p> Content:\n"
             ,(ulong)uVar1,uVar2,uVar3,(ulong)uVar4,uVar6,*(undefined8 *)(in_RSI->buffer_ + 0x10));
  SimpleStringBuffer::addMemoryDump(in_RSI,in_RDI,CONCAT44(uVar4,in_stack_ffffffffffffffe0));
  s1 = (char *)(**(code **)(**(long **)(in_RSI->buffer_ + 0x28) + 0x28))();
  iVar5 = SimpleString::StrCmp(s1,"malloc");
  if (iVar5 == 0) {
    *(undefined1 *)(in_RDI + 1) = 1;
  }
  return;
}

Assistant:

void MemoryLeakOutputStringBuffer::reportMemoryLeak(MemoryLeakDetectorNode* leak)
{
    if (total_leaks_ == 0) {
        addMemoryLeakHeader();
    }

    total_leaks_++;
    outputBuffer_.add("Alloc num (%u) Leak size: %lu Allocated at: %s and line: %d. Type: \"%s\"\n\tMemory: <%p> Content:\n",
            leak->number_, (unsigned long) leak->size_, leak->file_, (int) leak->line_, leak->allocator_->alloc_name(), (void*) leak->memory_);
    outputBuffer_.addMemoryDump(leak->memory_, leak->size_);

    if (SimpleString::StrCmp(leak->allocator_->alloc_name(), (const char*) "malloc") == 0)
        giveWarningOnUsingMalloc_ = true;
}